

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O0

int read_quoted(void)

{
  int iVar1;
  int iVar2;
  int ch_1;
  int ch;
  int x;
  int d;
  int c;
  
  x = fgetc((FILE *)fin);
  if (x == 10) {
    lineno = lineno + 1;
    d = -1;
  }
  else if (x == 0x61) {
    d = 7;
  }
  else if (x == 0x62) {
    d = 8;
  }
  else if (x == 0x66) {
    d = 0xc;
  }
  else if (x == 0x6e) {
    d = 10;
  }
  else if (x == 0x72) {
    d = 0xd;
  }
  else if (x == 0x74) {
    d = 9;
  }
  else if (x == 0x76) {
    d = 0xb;
  }
  else {
    if (x == 0x78) {
      x = 0;
      for (ch_1 = 0; ch_1 < 3; ch_1 = ch_1 + 1) {
        iVar1 = fgetc((FILE *)fin);
        iVar2 = hexdigit(iVar1);
        if (0xf < iVar2) {
          ungetc(iVar1,(FILE *)fin);
          break;
        }
        x = x * 0x10 + iVar2;
      }
    }
    else if ((0x2f < x) && (x < 0x38)) {
      x = x + -0x30;
      for (ch_1 = 0; ch_1 < 2; ch_1 = ch_1 + 1) {
        iVar1 = fgetc((FILE *)fin);
        iVar2 = hexdigit(iVar1);
        if (7 < iVar2) {
          ungetc(iVar1,(FILE *)fin);
          break;
        }
        x = x * 8 + iVar2;
      }
    }
    d = x;
  }
  return d;
}

Assistant:

static int read_quoted() {	// read whatever character is after a \ .
  int c,d,x;
  switch(c = fgetc(fin)) {
  case '\n': lineno++; return -1;
  case 'a' : return('\a');
  case 'b' : return('\b');
  case 'f' : return('\f');
  case 'n' : return('\n');
  case 'r' : return('\r');
  case 't' : return('\t');
  case 'v' : return('\v');
  case 'x' :	/* read hex */
    for (c=x=0; x<3; x++) {
      int ch = fgetc(fin);
      d = hexdigit(ch);
      if (d > 15) {ungetc(ch,fin); break;}
      c = (c<<4)+d;
    }
    break;
  default:		/* read octal */
    if (c<'0' || c>'7') break;
    c -= '0';
    for (x=0; x<2; x++) {
      int ch = fgetc(fin);
      d = hexdigit(ch);
      if (d>7) {ungetc(ch,fin); break;}
      c = (c<<3)+d;
    }
    break;
  }
  return(c);
}